

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.h
# Opt level: O0

cmCommand * __thiscall cmLoadCacheCommand::Clone(cmLoadCacheCommand *this)

{
  cmLoadCacheCommand *this_00;
  cmLoadCacheCommand *this_local;
  
  this_00 = (cmLoadCacheCommand *)operator_new(0xa0);
  cmLoadCacheCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmLoadCacheCommand;
    }